

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O2

int beagleSetTipStates(int instance,int tipIndex,int *inStates)

{
  int iVar1;
  BeagleImpl *pBVar2;
  
  pBVar2 = beagle::getBeagleInstance(instance);
  if (pBVar2 == (BeagleImpl *)0x0) {
    iVar1 = -4;
  }
  else {
    iVar1 = (**(code **)(*(long *)pBVar2 + 0x28))(pBVar2,tipIndex,inStates);
  }
  return iVar1;
}

Assistant:

int beagleSetTipStates(int instance,
                 int tipIndex,
                 const int* inStates) {
    DEBUG_START_TIME();
    try {
        beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
        if (beagleInstance == NULL)
            return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
        int returnValue = beagleInstance->setTipStates(tipIndex, inStates);
        DEBUG_END_TIME();
        return returnValue;
    }
    catch (std::bad_alloc &) {
        return BEAGLE_ERROR_OUT_OF_MEMORY;
    }
    catch (std::out_of_range &) {
        return BEAGLE_ERROR_OUT_OF_RANGE;
    }
    catch (...) {
        return BEAGLE_ERROR_UNIDENTIFIED_EXCEPTION;
    }
}